

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

xmlParserInputBufferPtr xmlParserInputBufferCreateFd(int fd,xmlCharEncoding enc)

{
  int *piVar1;
  xmlFdIOCtxt *fdctxt;
  xmlParserInputBufferPtr ret;
  xmlCharEncoding enc_local;
  int fd_local;
  
  if (fd < 0) {
    _enc_local = (xmlParserInputBufferPtr)0x0;
  }
  else {
    _enc_local = xmlAllocParserInputBuffer(enc);
    if (_enc_local != (xmlParserInputBufferPtr)0x0) {
      piVar1 = (int *)(*xmlMalloc)(4);
      if (piVar1 == (int *)0x0) {
        _enc_local = (xmlParserInputBufferPtr)0x0;
      }
      else {
        *piVar1 = fd;
        _enc_local->context = piVar1;
        _enc_local->readcallback = xmlFdRead;
        _enc_local->closecallback = xmlFdFree;
      }
    }
  }
  return _enc_local;
}

Assistant:

xmlParserInputBufferPtr
xmlParserInputBufferCreateFd(int fd, xmlCharEncoding enc) {
    xmlParserInputBufferPtr ret;

    if (fd < 0) return(NULL);

    ret = xmlAllocParserInputBuffer(enc);
    if (ret != NULL) {
        xmlFdIOCtxt *fdctxt;

        fdctxt = xmlMalloc(sizeof(*fdctxt));
        if (fdctxt == NULL) {
            return(NULL);
        }
        fdctxt->fd = fd;

        ret->context = fdctxt;
	ret->readcallback = xmlFdRead;
        ret->closecallback = xmlFdFree;
    }

    return(ret);
}